

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::NavigationBar::removeWidget(NavigationBar *this,QWidget *widget)

{
  int iVar1;
  
  iVar1 = QStackedWidget::indexOf((QWidget *)((this->d).d)->stack);
  if (iVar1 != -1) {
    NavigationBarPrivate::removeWidget((this->d).d,widget);
    QList<int>::clear(&(((this->d).d)->backStack).super_QList<int>);
    QList<int>::clear(&(((this->d).d)->forwardStack).super_QList<int>);
    QWidget::hide();
    QWidget::hide();
    return;
  }
  return;
}

Assistant:

void
NavigationBar::removeWidget( QWidget * widget )
{
	const int index = d->stack->indexOf( widget );

	if( index != -1 )
	{
		d->removeWidget( widget );

		d->backStack.clear();
		d->forwardStack.clear();

		d->left->hide();
		d->right->hide();
	}
}